

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

void * __thiscall ON_FixedSizePool::AllocateDirtyElement(ON_FixedSizePool *this)

{
  undefined8 *puVar1;
  size_t sVar2;
  void *local_38;
  void *next_block;
  void *p;
  ON_FixedSizePool *this_local;
  
  if (this->m_al_element_stack == (void *)0x0) {
    if ((this->m_al_block == (void *)0x0) || (this->m_al_count == 0)) {
      if (this->m_al_block == (void *)0x0) {
        local_38 = (void *)0x0;
      }
      else {
        local_38 = *this->m_al_block;
      }
      if (local_38 == (void *)0x0) {
        if (this->m_sizeof_element == 0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
                     ,0x15c,"",
                     "ON_FixedSizePool::AllocateElement - you must call ON_FixedSizePool::Create with a valid element size before using ON_FixedSizePool"
                    );
          return (void *)0x0;
        }
        if (this->m_al_count == 0) {
          this->m_al_count = this->m_block_element_count;
        }
        if (this->m_al_count == 0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_fsp.cpp"
                     ,0x165,"",
                     "ON_FixedSizePool::AllocateElement - you must call ON_FixedSizePool::Create with a valid element size before using ON_FixedSizePool"
                    );
          return (void *)0x0;
        }
        puVar1 = (undefined8 *)onmalloc(this->m_al_count * this->m_sizeof_element + 0x10);
        *puVar1 = 0;
        puVar1[1] = (long)puVar1 + this->m_al_count * this->m_sizeof_element + 0x10;
        if (this->m_first_block == (void *)0x0) {
          this->m_first_block = puVar1;
        }
        else {
          *(undefined8 **)this->m_al_block = puVar1;
        }
        this->m_al_block = puVar1;
      }
      else {
        this->m_al_block = local_38;
        sVar2 = BlockElementCapacity(this,this->m_al_block);
        this->m_al_count = sVar2;
      }
      this->m_al_element_array = (void *)((long)this->m_al_block + 0x10);
    }
    this->m_al_count = this->m_al_count - 1;
    next_block = this->m_al_element_array;
    this->m_al_element_array = (void *)((long)this->m_al_element_array + this->m_sizeof_element);
    this->m_total_element_count = this->m_total_element_count + 1;
  }
  else {
    next_block = this->m_al_element_stack;
    this->m_al_element_stack = *this->m_al_element_stack;
  }
  this->m_active_element_count = this->m_active_element_count + 1;
  return next_block;
}

Assistant:

void* ON_FixedSizePool::AllocateDirtyElement()
{
  void* p;

  if ( 0 != m_al_element_stack )
  {
    // use item on the returned stack first.
    p = m_al_element_stack;
    m_al_element_stack = *((void**)m_al_element_stack);
  }
  else
  {
    if ( 0 == m_al_block || 0 == m_al_count )
    {
      // No more memory left in m_al_block.
      void* next_block = (0 != m_al_block)
                       ? *((void**)m_al_block)
                       : 0;
      if ( 0 == next_block )
      {
        // This if clause is used when we need to allocate a new block from the heap
        if ( 0 == m_sizeof_element )
        {
          ON_ERROR("ON_FixedSizePool::AllocateElement - you must call ON_FixedSizePool::Create with a valid element size before using ON_FixedSizePool");
          return nullptr;
        }
        // allocate a new block
        if ( 0 == m_al_count )
          m_al_count = m_block_element_count;

        if ( m_al_count <= 0 )
        {
          ON_ERROR("ON_FixedSizePool::AllocateElement - you must call ON_FixedSizePool::Create with a valid element size before using ON_FixedSizePool");
          return nullptr;
        }

        p = onmalloc( 2*sizeof(void*) + m_al_count*m_sizeof_element ); // get some heap

        // set "next" pointer to zero
        *((void**)p) = nullptr;

        // set "end" pointer to address after last byte in the block
        *((void**)(((char*)p) + sizeof(void*))) = ((char*)p) + (2*sizeof(void*) + m_al_count*m_sizeof_element);
        if ( 0 == m_first_block )
        {
          m_first_block = p;
          // If the call to Create() specified a positive element_count_estimate,
          // then m_sizeof_block needs to be reset for any future block allocations.

        }
        else
        {
          // If m_first_block != 0, then m_al_block is nonzero (or memory for this class has been trashed)
          *((void**)m_al_block) = p;
        }
        m_al_block = p;
      }
      else
      {
        // If we get here, ReturnAll() was used at some point in
        // the past, m_al_block != 0, m_al_count = zero, and we are
        // reusing blocks that were allocated early.
        m_al_block = next_block;
        m_al_count = BlockElementCapacity(m_al_block);
      }

      m_al_element_array = (void*)(((char*)m_al_block)+2*sizeof(void*));
    }
    m_al_count--;
    p = m_al_element_array;
    m_al_element_array = (void*)(((char*)m_al_element_array) + m_sizeof_element);
    m_total_element_count++;
  }

  m_active_element_count++;

  return p;
}